

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::semaphore::try_release(semaphore *this,long releaseCount)

{
  long lVar1;
  
  if (0 < releaseCount) {
    lVar1 = releaseCount + 1;
    do {
      sem_post((sem_t *)this->m_sem);
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  return;
}

Assistant:

void semaphore::try_release(long releaseCount) {
  CRNLIB_ASSERT(releaseCount >= 1);

#ifdef WIN32
  if (1 == releaseCount)
    sem_post(m_sem);
  else
    sem_post_multiple(m_sem, releaseCount);
#else
  while (releaseCount > 0) {
    sem_post(m_sem);
    releaseCount--;
  }
#endif
}